

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

int enet_socket_get_address(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  socklen_t saLength;
  sockaddr_storage ss;
  
  saLength = 0x80;
  iVar1 = getsockname(socket,(sockaddr *)&ss,&saLength);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (ss.ss_family == 10) {
      *(undefined8 *)&address->field_0 = ss.__ss_padding._6_8_;
      *(undefined8 *)((long)&address->field_0 + 8) = ss.__ss_padding._14_8_;
    }
    else {
      if (ss.ss_family != 2) {
        return 0;
      }
      *(undefined8 *)&address->field_0 = 0;
      *(undefined4 *)((long)&address->field_0 + 8) = 0xffff0000;
      (address->field_0).ipv4.ip.s_addr = ss.__ss_padding._2_4_;
    }
    address->port = ss.__ss_padding._0_2_ << 8 | (ushort)ss.__ss_padding._0_2_ >> 8;
  }
  return iVar1;
}

Assistant:

int enet_socket_get_address(ENetSocket socket, ENetAddress* address) {
	struct sockaddr_storage ss;
	socklen_t saLength = sizeof(ss);

	if (getsockname(socket, (struct sockaddr*)&ss, &saLength) == -1) {
		ENET_LOG_ERROR("Getsockname() error.");
		return -1;
	}

	if (ss.ss_family == AF_INET) {
		struct sockaddr_in* sin = (struct sockaddr_in*)&ss;

		memset(address, 0, sizeof(address->ipv4.zeros));

		address->ipv4.ffff = 0xFFFF;
		address->ipv4.ip = sin->sin_addr;
		address->port = ENET_NET_TO_HOST_16(sin->sin_port);
	}
	else if (ss.ss_family == AF_INET6) {
		struct sockaddr_in6* sin = (struct sockaddr_in6*)&ss;

		address->ipv6 = sin->sin6_addr;
		address->port = ENET_NET_TO_HOST_16(sin->sin6_port);
	}

	return 0;
}